

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_exhaustive.c
# Opt level: O0

void test_exhaustive_ecmult(secp256k1_ge *group,secp256k1_gej *groupj)

{
  int iVar1;
  secp256k1_scalar ng_1;
  secp256k1_fe tmpf;
  secp256k1_fe xd;
  secp256k1_fe xn;
  secp256k1_gej tmp_1;
  int ret;
  secp256k1_scalar ng;
  secp256k1_scalar na;
  secp256k1_gej tmp;
  uint64_t iter;
  int r_log;
  int j;
  int i;
  secp256k1_scalar *in_stack_00000270;
  secp256k1_ge *in_stack_00000278;
  secp256k1_gej *in_stack_00000280;
  secp256k1_scalar *in_stack_00000488;
  secp256k1_scalar *in_stack_00000490;
  secp256k1_gej *in_stack_00000498;
  secp256k1_gej *in_stack_000004a0;
  undefined4 in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffdfc;
  secp256k1_fe *in_stack_fffffffffffffe00;
  secp256k1_fe *in_stack_fffffffffffffe28;
  secp256k1_fe *in_stack_fffffffffffffe30;
  secp256k1_ge *in_stack_fffffffffffffe88;
  secp256k1_gej *in_stack_fffffffffffffe90;
  int in_stack_ffffffffffffffbc;
  secp256k1_scalar *in_stack_ffffffffffffffc0;
  secp256k1_fe *in_stack_ffffffffffffffc8;
  secp256k1_fe *in_stack_ffffffffffffffd0;
  secp256k1_fe *r;
  int local_1c;
  int local_18;
  int local_14;
  
  r = (secp256k1_fe *)0x0;
  for (local_1c = 1; local_1c < 0xd; local_1c = local_1c + 1) {
    for (local_18 = 0; local_18 < 0xd; local_18 = local_18 + 1) {
      iVar1 = skip_section((uint64_t *)&stack0xffffffffffffffd8);
      if (iVar1 == 0) {
        for (local_14 = 0; local_14 < 0xd; local_14 = local_14 + 1) {
          secp256k1_scalar_set_int
                    ((secp256k1_scalar *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
          secp256k1_scalar_set_int
                    ((secp256k1_scalar *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
          secp256k1_ecmult(in_stack_000004a0,in_stack_00000498,in_stack_00000490,in_stack_00000488);
          iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                    ,0x93,
                    "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i * r_log + j) % EXHAUSTIVE_TEST_ORDER])"
                   );
            abort();
          }
        }
      }
    }
  }
  local_18 = 0;
  do {
    if (0xc < local_18) {
      return;
    }
    for (local_14 = 0; local_14 < 0xd; local_14 = local_14 + 1) {
      iVar1 = skip_section((uint64_t *)&stack0xffffffffffffffd8);
      if (iVar1 == 0) {
        secp256k1_scalar_set_int
                  ((secp256k1_scalar *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
        secp256k1_ecmult_const(in_stack_00000280,in_stack_00000278,in_stack_00000270);
        iVar1 = secp256k1_gej_eq_ge_var(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
        if (iVar1 == 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                  ,0xa5,
                  "test condition failed: secp256k1_gej_eq_ge_var(&tmp, &group[(i * j) % EXHAUSTIVE_TEST_ORDER])"
                 );
          abort();
        }
        if ((local_14 != 0) && (local_18 != 0)) {
          iVar1 = secp256k1_ecmult_const_xonly
                            (r,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                    ,0xaa,"test condition failed: ret");
            abort();
          }
          iVar1 = secp256k1_fe_equal(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                    ,0xab,
                    "test condition failed: secp256k1_fe_equal(&tmpf, &group[(i * j) % EXHAUSTIVE_TEST_ORDER].x)"
                   );
            abort();
          }
          testutil_random_fe_non_zero((secp256k1_fe *)0x10ca5a);
          secp256k1_fe_mul(in_stack_fffffffffffffe00,
                           (secp256k1_fe *)
                           CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                           (secp256k1_fe *)0x10ca80);
          iVar1 = secp256k1_ecmult_const_xonly
                            (r,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                    ,0xb1,"test condition failed: ret");
            abort();
          }
          iVar1 = secp256k1_fe_equal(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
          if (iVar1 == 0) {
            fprintf(_stderr,"%s:%d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/tests_exhaustive.c"
                    ,0xb2,
                    "test condition failed: secp256k1_fe_equal(&tmpf, &group[(i * j) % EXHAUSTIVE_TEST_ORDER].x)"
                   );
            abort();
          }
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

static void test_exhaustive_ecmult(const secp256k1_ge *group, const secp256k1_gej *groupj) {
    int i, j, r_log;
    uint64_t iter = 0;
    for (r_log = 1; r_log < EXHAUSTIVE_TEST_ORDER; r_log++) {
        for (j = 0; j < EXHAUSTIVE_TEST_ORDER; j++) {
            if (skip_section(&iter)) continue;
            for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++) {
                secp256k1_gej tmp;
                secp256k1_scalar na, ng;
                secp256k1_scalar_set_int(&na, i);
                secp256k1_scalar_set_int(&ng, j);

                secp256k1_ecmult(&tmp, &groupj[r_log], &na, &ng);
                CHECK(secp256k1_gej_eq_ge_var(&tmp, &group[(i * r_log + j) % EXHAUSTIVE_TEST_ORDER]));
            }
        }
    }

    for (j = 0; j < EXHAUSTIVE_TEST_ORDER; j++) {
        for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++) {
            int ret;
            secp256k1_gej tmp;
            secp256k1_fe xn, xd, tmpf;
            secp256k1_scalar ng;

            if (skip_section(&iter)) continue;

            secp256k1_scalar_set_int(&ng, j);

            /* Test secp256k1_ecmult_const. */
            secp256k1_ecmult_const(&tmp, &group[i], &ng);
            CHECK(secp256k1_gej_eq_ge_var(&tmp, &group[(i * j) % EXHAUSTIVE_TEST_ORDER]));

            if (i != 0 && j != 0) {
                /* Test secp256k1_ecmult_const_xonly with all curve X coordinates, and xd=NULL. */
                ret = secp256k1_ecmult_const_xonly(&tmpf, &group[i].x, NULL, &ng, 0);
                CHECK(ret);
                CHECK(secp256k1_fe_equal(&tmpf, &group[(i * j) % EXHAUSTIVE_TEST_ORDER].x));

                /* Test secp256k1_ecmult_const_xonly with all curve X coordinates, with random xd. */
                testutil_random_fe_non_zero(&xd);
                secp256k1_fe_mul(&xn, &xd, &group[i].x);
                ret = secp256k1_ecmult_const_xonly(&tmpf, &xn, &xd, &ng, 0);
                CHECK(ret);
                CHECK(secp256k1_fe_equal(&tmpf, &group[(i * j) % EXHAUSTIVE_TEST_ORDER].x));
            }
        }
    }
}